

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O3

TestResult * __thiscall JsonTest::TestResult::operator<<(TestResult *this,unsigned_long *value)

{
  uint *puVar1;
  TestResult *pTVar2;
  ostringstream oss;
  string local_1b0;
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x10;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190 + -0x18));
  *puVar1 = *puVar1 | 0x104;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  std::__cxx11::stringbuf::str();
  pTVar2 = addToLastFailure(this,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  return pTVar2;
}

Assistant:

TestResult& operator<<(const T& value) {
    std::ostringstream oss;
    oss.precision(16);
    oss.setf(std::ios_base::floatfield);
    oss << value;
    return addToLastFailure(oss.str());
  }